

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_shape.cpp
# Opt level: O2

Reals __thiscall
Omega_h::measure_edges_metric_tmpl<3,1>(Omega_h *this,Mesh *mesh,LOs *a2e,Reals *metrics)

{
  Alloc *pAVar1;
  void *extraout_RDX;
  LO size_in;
  size_t sVar2;
  Reals RVar3;
  allocator local_d1;
  Write<double> lengths;
  Write<signed_char> local_c0;
  LOs ev2v;
  Write<double> local_a0;
  type f;
  MetricEdgeLengths<3,_3> measurer;
  
  Write<double>::Write(&local_a0,&metrics->write_);
  MetricEdgeLengths<3,_1>::MetricEdgeLengths
            ((MetricEdgeLengths<3,_1> *)&measurer,mesh,(Reals *)&local_a0);
  Write<double>::~Write(&local_a0);
  Mesh::ask_verts_of((Mesh *)&ev2v,(Int)mesh);
  pAVar1 = (a2e->write_).shared_alloc_.alloc;
  if (((ulong)pAVar1 & 1) == 0) {
    sVar2 = pAVar1->size;
  }
  else {
    sVar2 = (ulong)pAVar1 >> 3;
  }
  std::__cxx11::string::string((string *)&f,"",&local_d1);
  size_in = (LO)(sVar2 >> 2);
  Write<double>::Write(&lengths,size_in,(string *)&f);
  std::__cxx11::string::~string((string *)&f);
  Write<int>::Write((Write<int> *)&f,&a2e->write_);
  Write<int>::Write(&f.ev2v.write_,&ev2v.write_);
  Write<double>::Write(&f.lengths,&lengths);
  MetricEdgeLengths<3,_1>::MetricEdgeLengths((MetricEdgeLengths<3,_1> *)&f.measurer,&measurer);
  parallel_for<Omega_h::measure_edges_metric_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::_lambda(int)_1_>
            (size_in,&f,"measure_edges");
  Write<double>::Write(&local_c0,(Write<signed_char> *)&lengths);
  Read<double>::Read((Read<signed_char> *)this,(Write<double> *)&local_c0);
  Write<double>::~Write((Write<double> *)&local_c0);
  measure_edges_metric_tmpl<3,1>(Omega_h::Mesh*,Omega_h::Read<int>,Omega_h::Read<double>)::
  {lambda(int)#1}::~Mesh((_lambda_int__1_ *)&f);
  Write<double>::~Write(&lengths);
  Write<int>::~Write(&ev2v.write_);
  MetricEdgeLengths<3,_1>::~MetricEdgeLengths((MetricEdgeLengths<3,_1> *)&measurer);
  RVar3.write_.shared_alloc_.direct_ptr = extraout_RDX;
  RVar3.write_.shared_alloc_.alloc = (Alloc *)this;
  return (Reals)RVar3.write_.shared_alloc_;
}

Assistant:

Reals measure_edges_metric_tmpl(Mesh* mesh, LOs a2e, Reals metrics) {
  MetricEdgeLengths<mesh_dim, metric_dim> measurer(mesh, metrics);
  auto ev2v = mesh->ask_verts_of(EDGE);
  auto na = a2e.size();
  Write<Real> lengths(na);
  auto f = OMEGA_H_LAMBDA(LO a) {
    auto e = a2e[a];
    auto v = gather_verts<2>(ev2v, e);
    lengths[a] = measurer.measure(v);
  };
  parallel_for(na, f, "measure_edges");
  return lengths;
}